

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

bool __thiscall gnilk::LogManager::RemoveSink(LogManager *this,string *name)

{
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *puVar1;
  bool bVar2;
  long lVar3;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  _Var4;
  __normal_iterator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_*,_std::vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>_>
  __it;
  long lVar5;
  string *local_48;
  unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *local_40;
  vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
  *local_38;
  
  std::mutex::lock(&this->sinkLock);
  local_38 = &this->sinks;
  __it._M_current =
       (this->sinks).
       super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_40 = (this->sinks).
             super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)local_40 - (long)__it._M_current;
  local_48 = name;
  for (lVar5 = lVar3 >> 5; _Var4._M_current = __it._M_current, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_48,__it);
    if (bVar2) goto LAB_0019ec8d;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_48,__it._M_current + 1);
    _Var4._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0019ec8d;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_48,__it._M_current + 2);
    _Var4._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0019ec8d;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_48,__it._M_current + 3);
    _Var4._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0019ec8d;
    __it._M_current = __it._M_current + 4;
    lVar3 = lVar3 + -0x20;
  }
  lVar3 = lVar3 >> 3;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = local_40;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::
                  operator()((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                              *)&local_48,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_0019ec8d;
      _Var4._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                      ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0>
                        *)&local_48,_Var4);
    if (bVar2) goto LAB_0019ec8d;
    __it._M_current = _Var4._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::$_0>::operator()
                    ((_Iter_pred<gnilk::LogManager::RemoveSink(std::__cxx11::string_const&)::__0> *)
                     &local_48,__it);
  _Var4._M_current = local_40;
  if (bVar2) {
    _Var4._M_current = __it._M_current;
  }
LAB_0019ec8d:
  puVar1 = (this->sinks).
           super__Vector_base<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current != puVar1) {
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
    ::erase(local_38,(const_iterator)_Var4._M_current);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->sinkLock);
  return _Var4._M_current != puVar1;
}

Assistant:

bool LogManager::RemoveSink(const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);

    auto itSink = std::find_if(sinks.begin(), sinks.end(), [&name](const LogSinkInstance::Ref &other)->bool {
        return (other->GetName() == name);
    });

    if (itSink == sinks.end()) {
        return false;
    }
    sinks.erase(itSink);
    return true;
}